

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

int bus0_sock_get_recv_buf_len(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  size_t sVar2;
  int val;
  bus0_sock *s;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  sVar2 = nni_lmq_cap((nni_lmq *)((long)arg + 0x60));
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  iVar1 = nni_copyout_int((int)sVar2,buf,szp,t);
  return iVar1;
}

Assistant:

static int
bus0_sock_get_recv_buf_len(void *arg, void *buf, size_t *szp, nni_type t)
{
	bus0_sock *s = arg;
	int        val;
	nni_mtx_lock(&s->mtx);
	val = (int) nni_lmq_cap(&s->recv_msgs);
	nni_mtx_unlock(&s->mtx);

	return (nni_copyout_int(val, buf, szp, t));
}